

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O0

string * cmVariableWatch::GetAccessAsString_abi_cxx11_(int access_type)

{
  int iVar1;
  const_reference pvVar2;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
  *local_18;
  int local_c;
  int access_type_local;
  
  local_c = access_type;
  if (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetAccessAsString[abi:cxx11](int)::
                                 cmVariableWatchAccessStrings_abi_cxx11_);
    if (iVar1 != 0) {
      local_18 = &GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_,
                 "READ_ACCESS",&local_19);
      local_18 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                  *)0x11dbef8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 1),"UNKNOWN_READ_ACCESS",local_2d);
      local_18 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                  *)0x11dbf18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 2),"UNKNOWN_DEFINED_ACCESS",&local_2e);
      local_18 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                  *)0x11dbf38;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 3),"MODIFIED_ACCESS",&local_2f);
      local_18 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                  *)0x11dbf58;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 4),"REMOVED_ACCESS",&local_30);
      local_18 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                  *)0x11dbf78;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_.
                  _M_elems + 5),"NO_ACCESS",&local_31);
      std::allocator<char>::~allocator(&local_31);
      std::allocator<char>::~allocator(&local_30);
      std::allocator<char>::~allocator(&local_2f);
      std::allocator<char>::~allocator(&local_2e);
      std::allocator<char>::~allocator(local_2d);
      std::allocator<char>::~allocator(&local_19);
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                   ::~array,&GetAccessAsString[abi:cxx11](int)::
                             cmVariableWatchAccessStrings_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetAccessAsString[abi:cxx11](int)::
                           cmVariableWatchAccessStrings_abi_cxx11_);
    }
  }
  if ((local_c < 0) || (4 < local_c)) {
    local_c = 5;
  }
  pvVar2 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
           ::operator[](&GetAccessAsString[abi:cxx11](int)::cmVariableWatchAccessStrings_abi_cxx11_,
                        (long)local_c);
  return pvVar2;
}

Assistant:

const std::string& cmVariableWatch::GetAccessAsString(int access_type)
{
  static const std::array<std::string, 6> cmVariableWatchAccessStrings = {
    { "READ_ACCESS", "UNKNOWN_READ_ACCESS", "UNKNOWN_DEFINED_ACCESS",
      "MODIFIED_ACCESS", "REMOVED_ACCESS", "NO_ACCESS" }
  };
  if (access_type < 0 || access_type >= cmVariableWatch::NO_ACCESS) {
    access_type = cmVariableWatch::NO_ACCESS;
  }
  return cmVariableWatchAccessStrings[access_type];
}